

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureType::MergeFrom(FeatureType *this,FeatureType *from)

{
  bool bVar1;
  TypeCase TVar2;
  LogMessage *other;
  Int64FeatureType *this_00;
  Int64FeatureType *from_00;
  DoubleFeatureType *this_01;
  DoubleFeatureType *from_01;
  StringFeatureType *this_02;
  StringFeatureType *from_02;
  ImageFeatureType *this_03;
  ImageFeatureType *from_03;
  ArrayFeatureType *this_04;
  ArrayFeatureType *from_04;
  DictionaryFeatureType *this_05;
  DictionaryFeatureType *from_05;
  SequenceFeatureType *this_06;
  SequenceFeatureType *from_06;
  InternalMetadataWithArenaLite *this_07;
  LogFinisher local_a5;
  uint32 cached_has_bits;
  byte local_91;
  LogMessage local_90;
  FeatureType *local_58;
  FeatureType *from_local;
  FeatureType *this_local;
  InternalMetadataWithArenaLite *local_40;
  InternalMetadataWithArenaLite *local_38;
  InternalMetadataWithArenaLite *local_30;
  InternalMetadataWithArenaLite *local_28;
  Container *local_20;
  InternalMetadataWithArenaLite *local_18;
  InternalMetadataWithArenaLite *local_10;
  
  local_91 = 0;
  local_58 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O0/mlmodel/format/FeatureTypes.pb.cc"
               ,0x129c);
    local_91 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_90,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_a5,other);
  }
  if ((local_91 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  this_07 = &this->_internal_metadata_;
  this_local = (FeatureType *)&local_58->_internal_metadata_;
  local_40 = this_07;
  local_38 = (InternalMetadataWithArenaLite *)this_local;
  local_30 = (InternalMetadataWithArenaLite *)this_local;
  if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    local_28 = (InternalMetadataWithArenaLite *)this_local;
    local_18 = (InternalMetadataWithArenaLite *)this_local;
    local_10 = (InternalMetadataWithArenaLite *)this_local;
    if (((uint)(((InternalMetadataWithArenaLite *)this_local)->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_local);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (this_07,&local_20->unknown_fields);
  }
  bVar1 = isoptional(local_58);
  if (bVar1) {
    bVar1 = isoptional(local_58);
    set_isoptional(this,bVar1);
  }
  TVar2 = Type_case(local_58);
  switch(TVar2) {
  case TYPE_NOT_SET:
    break;
  case kInt64Type:
    this_00 = mutable_int64type(this);
    from_00 = int64type(local_58);
    Int64FeatureType::MergeFrom(this_00,from_00);
    break;
  case kDoubleType:
    this_01 = mutable_doubletype(this);
    from_01 = doubletype(local_58);
    DoubleFeatureType::MergeFrom(this_01,from_01);
    break;
  case kStringType:
    this_02 = mutable_stringtype(this);
    from_02 = stringtype(local_58);
    StringFeatureType::MergeFrom(this_02,from_02);
    break;
  case kImageType:
    this_03 = mutable_imagetype(this);
    from_03 = imagetype(local_58);
    ImageFeatureType::MergeFrom(this_03,from_03);
    break;
  case kMultiArrayType:
    this_04 = mutable_multiarraytype(this);
    from_04 = multiarraytype(local_58);
    ArrayFeatureType::MergeFrom(this_04,from_04);
    break;
  case kDictionaryType:
    this_05 = mutable_dictionarytype(this);
    from_05 = dictionarytype(local_58);
    DictionaryFeatureType::MergeFrom(this_05,from_05);
    break;
  case kSequenceType:
    this_06 = mutable_sequencetype(this);
    from_06 = sequencetype(local_58);
    SequenceFeatureType::MergeFrom(this_06,from_06);
  }
  return;
}

Assistant:

void FeatureType::MergeFrom(const FeatureType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.FeatureType)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.isoptional() != 0) {
    set_isoptional(from.isoptional());
  }
  switch (from.Type_case()) {
    case kInt64Type: {
      mutable_int64type()->::CoreML::Specification::Int64FeatureType::MergeFrom(from.int64type());
      break;
    }
    case kDoubleType: {
      mutable_doubletype()->::CoreML::Specification::DoubleFeatureType::MergeFrom(from.doubletype());
      break;
    }
    case kStringType: {
      mutable_stringtype()->::CoreML::Specification::StringFeatureType::MergeFrom(from.stringtype());
      break;
    }
    case kImageType: {
      mutable_imagetype()->::CoreML::Specification::ImageFeatureType::MergeFrom(from.imagetype());
      break;
    }
    case kMultiArrayType: {
      mutable_multiarraytype()->::CoreML::Specification::ArrayFeatureType::MergeFrom(from.multiarraytype());
      break;
    }
    case kDictionaryType: {
      mutable_dictionarytype()->::CoreML::Specification::DictionaryFeatureType::MergeFrom(from.dictionarytype());
      break;
    }
    case kSequenceType: {
      mutable_sequencetype()->::CoreML::Specification::SequenceFeatureType::MergeFrom(from.sequencetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
}